

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake2_generator.cpp
# Opt level: O0

uint32_t __thiscall randomx::Blake2Generator::getUInt32(Blake2Generator *this)

{
  uint32_t uVar1;
  size_t in_RDI;
  uint32_t ret;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  checkData((Blake2Generator *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),in_RDI)
  ;
  uVar1 = load32((void *)(in_RDI + *(long *)(in_RDI + 0x40)));
  *(long *)(in_RDI + 0x40) = *(long *)(in_RDI + 0x40) + 4;
  return uVar1;
}

Assistant:

uint32_t Blake2Generator::getUInt32() {
		checkData(4);
		auto ret = load32(&data[dataIndex]);
		dataIndex += 4;
		return ret;
	}